

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QLocalePrivate>::reset
          (QSharedDataPointer<QLocalePrivate> *this,QLocalePrivate *ptr)

{
  QBasicAtomicInt *pQVar1;
  QLocalePrivate *pQVar2;
  
  pQVar2 = (this->d).ptr;
  if (pQVar2 != ptr) {
    if (ptr != (QLocalePrivate *)0x0) {
      LOCK();
      (ptr->ref)._q_value.super___atomic_base<int>._M_i =
           (ptr->ref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar2 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar2 != (QLocalePrivate *)0x0) {
      LOCK();
      pQVar1 = &pQVar2->ref;
      (pQVar1->_q_value).super___atomic_base<int>._M_i =
           (pQVar1->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->_q_value).super___atomic_base<int>._M_i == 0) {
        operator_delete(pQVar2,0x20);
        return;
      }
    }
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }